

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_ldst_modrm(CPUX86State *env,DisasContext *s,int modrm,MemOp ot,int reg,int is_store)

{
  TCGv_i64 t0;
  uint reg_00;
  
  if ((~modrm & 0xc0U) == 0) {
    reg_00 = modrm & 7U | s->rex_b;
    if (is_store != 0) {
      if (reg != 0x10) {
        gen_op_mov_v_reg(s,ot,s->T0,reg);
      }
      t0 = s->T0;
      reg = reg_00;
      goto LAB_004e7dea;
    }
    gen_op_mov_v_reg(s,ot,s->T0,reg_00);
  }
  else {
    gen_lea_modrm(env,s,modrm);
    if (is_store != 0) {
      if (reg != 0x10) {
        gen_op_mov_v_reg(s,ot,s->T0,reg);
      }
      gen_op_st_v(s,ot,s->T0,s->A0);
      return;
    }
    gen_op_ld_v(s,ot,s->T0,s->A0);
  }
  if (reg == 0x10) {
    return;
  }
  t0 = s->T0;
LAB_004e7dea:
  gen_op_mov_reg_v(s,ot,reg,t0);
  return;
}

Assistant:

static void gen_ldst_modrm(CPUX86State *env, DisasContext *s, int modrm,
                           MemOp ot, int reg, int is_store)
{
    int mod, rm;

    mod = (modrm >> 6) & 3;
    rm = (modrm & 7) | REX_B(s);
    if (mod == 3) {
        if (is_store) {
            if (reg != OR_TMP0)
                gen_op_mov_v_reg(s, ot, s->T0, reg);
            gen_op_mov_reg_v(s, ot, rm, s->T0);
        } else {
            gen_op_mov_v_reg(s, ot, s->T0, rm);
            if (reg != OR_TMP0)
                gen_op_mov_reg_v(s, ot, reg, s->T0);
        }
    } else {
        gen_lea_modrm(env, s, modrm);
        if (is_store) {
            if (reg != OR_TMP0)
                gen_op_mov_v_reg(s, ot, s->T0, reg);
            gen_op_st_v(s, ot, s->T0, s->A0);
        } else {
            gen_op_ld_v(s, ot, s->T0, s->A0);
            if (reg != OR_TMP0)
                gen_op_mov_reg_v(s, ot, reg, s->T0);
        }
    }
}